

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

void S_ParseSndInfo(bool redefine)

{
  sfxinfo_t *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *logicalname;
  Node *pNVar5;
  int iVar6;
  long lVar7;
  undefined7 in_register_00000039;
  FMemLump FVar8;
  ulong uVar9;
  FMemLump local_48;
  undefined8 uStack_40;
  
  if (((int)CONCAT71(in_register_00000039,redefine) == 0) && (SavedPlayerSounds.Count != 0)) {
    SavedPlayerSounds.Count = 0;
  }
  addterm(S_ClearSoundData,"S_ClearSoundData");
  S_ClearSoundData();
  CurrentPitchMask = '\0';
  iVar3 = FWadCollection::CheckNumForFullName(&Wads,"DSEMPTY",true,0xd);
  iVar6 = 0;
  S_AddSound("{ no sound }",iVar3,(FScanner *)0x0);
  iVar3 = FWadCollection::GetNumLumps(&Wads);
  if (0 < iVar3) {
    do {
      iVar3 = FWadCollection::GetLumpNamespace(&Wads,iVar6);
      if (iVar3 == 9) {
        local_48.Block.Chars = (FString)(char *)0x2f786f7673;
        uStack_40._0_4_ = 0;
        uStack_40._4_4_ = 0;
        FWadCollection::GetLumpName(&Wads,(char *)((long)&local_48.Block.Chars + 5),iVar6);
        S_AddSound((char *)&local_48,iVar6,(FScanner *)0x0);
      }
      else if (iVar3 == 7) {
        FWadCollection::ReadLump((FWadCollection *)&local_48,0xaad1d0);
        FVar8.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
        if (*(int *)((long)local_48.Block.Chars + -0xc) != 0) {
          FVar8.Block.Chars = local_48.Block.Chars;
        }
        iVar3 = FWadCollection::CheckNumForName(&Wads,(char *)((long)FVar8.Block.Chars + 0x14),6);
        if (iVar3 != -1) {
          logicalname = FWadCollection::GetLumpFullName(&Wads,iVar6);
          iVar3 = S_AddSound(logicalname,iVar3,(FScanner *)0x0);
          psVar1 = S_sfx.Array;
          if (*(uint *)((long)FVar8.Block.Chars + 0xc) - 0xd < 0xfffffff8) {
            S_sfx.Array[iVar3].RawRate = 0x2b11;
          }
          else if (*(uint *)((long)FVar8.Block.Chars + 0xc) < 9) {
            S_sfx.Array[iVar3].RawRate = 0x5622;
          }
          else {
            S_sfx.Array[iVar3].RawRate = 0xac44;
          }
          psVar1[iVar3].field_0x30 = psVar1[iVar3].field_0x30 | 4;
          S_sfx.Array[iVar3].LoopStart = *(int *)((long)FVar8.Block.Chars + 0x10);
          iVar4 = FWadCollection::GetLumpIndexNum(&Wads,iVar6);
          pNVar5 = TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::GetNode
                             (&Ambients,iVar4);
          (pNVar5->Pair).Value.type = 3;
          (pNVar5->Pair).Value.periodmin = 0;
          (pNVar5->Pair).Value.periodmax = 0;
          (pNVar5->Pair).Value.volume = 1.0;
          (pNVar5->Pair).Value.attenuation = 1.0;
          (pNVar5->Pair).Value.sound.ID = iVar3;
        }
        FMemLump::~FMemLump(&local_48);
      }
      else if ((iVar3 == 0) && (bVar2 = FWadCollection::CheckLumpName(&Wads,iVar6,"SNDINFO"), bVar2)
              ) {
        S_AddSNDINFO(iVar6);
      }
      iVar6 = iVar6 + 1;
      iVar3 = FWadCollection::GetNumLumps(&Wads);
    } while (iVar6 < iVar3);
  }
  if (SavedPlayerSounds.Count != 0) {
    lVar7 = 0x10;
    uVar9 = 0;
    do {
      iVar3 = *(int *)((long)SavedPlayerSounds.Array + lVar7 + -0xc);
      iVar6 = *(int *)((long)SavedPlayerSounds.Array + lVar7 + -8);
      iVar4 = *(int *)((long)SavedPlayerSounds.Array + lVar7 + -4);
      if (*(char *)((long)&((SavedPlayerSounds.Array)->pclass).Index + lVar7) == '\x01') {
        S_AddPlayerSoundExisting
                  (FName::NameData.NameArray
                   [*(int *)((long)SavedPlayerSounds.Array + lVar7 + -0x10)].Text,iVar3,iVar6,iVar4,
                   false);
      }
      else {
        S_AddPlayerSound(FName::NameData.NameArray
                         [*(int *)((long)SavedPlayerSounds.Array + lVar7 + -0x10)].Text,iVar3,iVar6,
                         iVar4,false);
      }
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x14;
    } while (uVar9 < SavedPlayerSounds.Count);
  }
  S_HashSounds();
  TArray<sfxinfo_t,_sfxinfo_t>::ShrinkToFit(&S_sfx);
  if (S_rnd.Count != 0) {
    TArray<FRandomSoundList,_FRandomSoundList>::ShrinkToFit(&S_rnd);
  }
  S_ShrinkPlayerSoundLists();
  sfx_empty = FWadCollection::CheckNumForName(&Wads,"dsempty",0xd);
  return;
}

Assistant:

void S_ParseSndInfo (bool redefine)
{
	int lump;

	if (!redefine) SavedPlayerSounds.Clear();	// clear skin sounds only for initial parsing.
	atterm (S_ClearSoundData);
	S_ClearSoundData();	// remove old sound data first!

	CurrentPitchMask = 0;
	S_AddSound ("{ no sound }", "DSEMPTY");	// Sound 0 is no sound at all
	for (lump = 0; lump < Wads.GetNumLumps(); ++lump)
	{
		switch (Wads.GetLumpNamespace (lump))
		{
		case ns_global:
			if (Wads.CheckLumpName (lump, "SNDINFO"))
			{
				S_AddSNDINFO (lump);
			}
			break;

		case ns_bloodsfx:
			S_AddBloodSFX (lump);
			break;

		case ns_strifevoices:
			S_AddStrifeVoice (lump);
			break;
		}
	}
	S_RestorePlayerSounds();
	S_HashSounds ();
	S_sfx.ShrinkToFit ();

	if (S_rnd.Size() > 0)
	{
		S_rnd.ShrinkToFit ();
	}

	S_ShrinkPlayerSoundLists ();

	sfx_empty = Wads.CheckNumForName ("dsempty", ns_sounds);
}